

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O1

float ht_cpu_usage_get_percentage(HT_CPUUsageContext *context)

{
  bool bVar1;
  int iVar2;
  HT_TimestampNs HVar3;
  FILE *__stream;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  float fVar7;
  char state;
  int int_data [5];
  unsigned_long stime;
  unsigned_long utime;
  uint flags;
  unsigned_long long_data [4];
  char local_438 [1032];
  
  HVar3 = std::chrono::_V2::steady_clock::now();
  pFVar6 = (FILE *)(ulong)(uint)context->pid;
  snprintf(local_438,0x20,"/proc/%d/stat");
  __stream = fopen(local_438,"r");
  bVar1 = true;
  if (__stream != (FILE *)0x0) {
    pFVar6 = __stream;
    sVar4 = fread(local_438,1,0x3ff,__stream);
    fclose(__stream);
    if (0x4f < sVar4) {
      local_438[sVar4] = '\0';
      pcVar5 = strrchr(local_438,0x29);
      pFVar6 = (FILE *)int_data;
      iVar2 = __isoc99_sscanf(pcVar5 + 2,"%c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu",&state,
                              pFVar6,int_data + 1,int_data + 2,int_data + 3,int_data + 4,&flags,
                              long_data,long_data + 1,long_data + 2,long_data + 3,&utime,&stime);
      if (iVar2 == 0xd) {
        pFVar6 = (FILE *)(stime + utime);
        bVar1 = false;
      }
    }
  }
  if (bVar1) {
    fVar7 = -1.0;
  }
  else {
    fVar7 = ((float)((long)pFVar6 - context->last_total_time) * 100.0) /
            (((float)(HVar3 - context->last_probe) / 1e+09) * (float)_clock_ticks_per_sec);
    context->value = fVar7;
    context->last_total_time = (unsigned_long)pFVar6;
    context->last_probe = HVar3;
  }
  return fVar7;
}

Assistant:

float
ht_cpu_usage_get_percentage(HT_CPUUsageContext* context)
{
    HT_TimestampNs current_ts = ht_monotonic_clock_get_timestamp();
    unsigned long total_time;
    unsigned long tics;
    float elapsed;

    if (_get_process_time(&total_time, context->pid) == HT_FALSE)
    {
        return -1.0f;
    }

    tics = total_time - context->last_total_time;
    elapsed = (current_ts - context->last_probe) / 1000000000.0f;

    context->value = tics * 100.0f / (_clock_ticks_per_sec * elapsed);
    context->last_total_time = total_time;
    context->last_probe = current_ts;

    return context->value;
}